

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSparsityPatternLearner.h
# Opt level: O1

void __thiscall
chrono::ChSparsityPatternLearner::Apply(ChSparsityPatternLearner *this,ChSparseMatrix *mat)

{
  pointer plVar1;
  pointer plVar2;
  StorageIndex *pSVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  pointer plVar7;
  StorageIndex *pSVar8;
  
  if (this->processed == false) {
    process(this);
  }
  Eigen::SparseMatrix<double,_1,_int>::resize
            (mat,(this->super_SparseMatrix<double,_1,_int>).m_outerSize,
             (this->super_SparseMatrix<double,_1,_int>).m_innerSize);
  Eigen::SparseMatrix<double,1,int>::reserveInnerVectors<std::vector<int,std::allocator<int>>>
            ((SparseMatrix<double,1,int> *)mat,&this->innerVectors_size);
  plVar2 = (this->innerVectors).
           super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->innerVectors).
                super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)plVar2;
  if (lVar4 != 0) {
    lVar4 = (lVar4 >> 3) * -0x5555555555555555;
    pSVar3 = (mat->m_data).m_indices;
    lVar5 = 0;
    iVar6 = 0;
    do {
      plVar1 = plVar2 + lVar5;
      plVar7 = *(pointer *)&(plVar1->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node;
      if (plVar7 != plVar1) {
        pSVar8 = pSVar3 + iVar6;
        do {
          *pSVar8 = *(StorageIndex *)
                     ((long)&(plVar7->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node +
                     0x10);
          plVar7 = *(pointer *)
                    &(plVar7->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node;
          pSVar8 = pSVar8 + 1;
          iVar6 = iVar6 + 1;
        } while (plVar7 != plVar1);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar4 + (ulong)(lVar4 == 0));
  }
  return;
}

Assistant:

void Apply(ChSparseMatrix& mat) {
        if (!processed)
            process();

        // Resize the matrix and reserve space for non-zero elements in each inner vector
        mat.resize(rows(), cols());
        mat.reserve(innerVectors_size);

        int col_el = 0;
        for (auto outer = 0; outer < innerVectors.size(); ++outer) {
            for (auto inner = innerVectors[outer].begin(); inner != innerVectors[outer].end(); ++inner) {
                mat.innerIndexPtr()[col_el] = *inner;
                col_el++;
            }
        }
    }